

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightBounds * __thiscall
pbrt::DiffuseAreaLight::Bounds(LightBounds *__return_storage_ptr__,DiffuseAreaLight *this)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  float *__result;
  Tuple2<pbrt::Point2,_int> TVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  int c;
  int c_00;
  Curve *this_00;
  Point2i p;
  ulong uVar9;
  Float FVar10;
  float fVar11;
  float __x;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 local_78 [12];
  Float FStack_6c;
  bool local_68;
  LightBounds *local_60;
  long local_58;
  ulong local_50;
  Bounds3f local_48;
  
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    pfVar6 = (this->Lemit).values.ptr;
    uVar9 = (this->Lemit).values.nStored;
    if (1 < uVar9) {
      auVar12 = ZEXT464((uint)*pfVar6);
      lVar7 = uVar9 * 4 + -4;
      pfVar8 = pfVar6;
      do {
        pfVar8 = pfVar8 + 1;
        fVar11 = auVar12._0_4_;
        auVar15 = vmaxss_avx(ZEXT416((uint)*pfVar8),auVar12._0_16_);
        auVar12 = ZEXT1664(auVar15);
        if (fVar11 < *pfVar8) {
          pfVar6 = pfVar8;
        }
        lVar7 = lVar7 + -4;
      } while (lVar7 != 0);
    }
    fVar11 = *pfVar6;
  }
  else {
    TVar5 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    if (TVar5.y < 1) {
      fVar11 = 0.0;
    }
    else {
      fVar11 = 0.0;
      lVar7 = 0;
      local_60 = __return_storage_ptr__;
      do {
        local_58 = lVar7;
        if (0 < TVar5.x) {
          local_50 = lVar7 << 0x20;
          uVar9 = 0;
          do {
            c_00 = 0;
            p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_50 | uVar9);
            do {
              FVar10 = Image::GetChannel(&this->image,p,c_00,(WrapMode2D)0x200000002);
              c_00 = c_00 + 1;
              fVar11 = fVar11 + FVar10;
            } while (c_00 != 3);
            TVar5 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
            uVar9 = uVar9 + 1;
          } while ((long)uVar9 < (long)TVar5.x);
        }
        lVar7 = local_58 + 1;
        __return_storage_ptr__ = local_60;
      } while (lVar7 < (long)TVar5 >> 0x20);
    }
    fVar11 = fVar11 / (float)(TVar5.x * TVar5.y * 3);
  }
  uVar9 = (this->shape).
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          .bits;
  local_60 = (LightBounds *)CONCAT44(local_60._4_4_,(uint)this->twoSided);
  local_50 = CONCAT44(local_50._4_4_,this->scale);
  local_58 = CONCAT44(local_58._4_4_,this->area);
  uVar4 = (uint)(ushort)(uVar9 >> 0x30);
  if (uVar9 >> 0x32 == 0) {
    if ((0x1ffffffffffff < uVar9) && (uVar4 != 2)) {
      Disk::NormalBounds((Disk *)(uVar9 & 0xffffffffffff));
      goto LAB_0037103d;
    }
  }
  else {
    uVar4 = uVar4 - 3;
    if (uVar4 < 2) {
      Triangle::NormalBounds((DirectionCone *)local_78,(Triangle *)(uVar9 & 0xffffffffffff));
      goto LAB_0037103d;
    }
    if (uVar4 == 2) {
      BilinearPatch::NormalBounds
                ((DirectionCone *)local_78,(BilinearPatch *)(uVar9 & 0xffffffffffff));
      goto LAB_0037103d;
    }
  }
  _local_78 = vmovhps_avx(ZEXT816(0) << 0x40,0xbf8000003f800000);
  local_68 = false;
LAB_0037103d:
  uVar9 = (this->shape).
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          .bits;
  uVar4 = (uint)(ushort)(uVar9 >> 0x30);
  if (uVar9 < 0x4000000000000) {
    if (uVar9 < 0x2000000000000) {
      Sphere::Bounds(&local_48,(Sphere *)(uVar9 & 0xffffffffffff));
    }
    else if (uVar4 == 2) {
      Cylinder::Bounds(&local_48,(Cylinder *)(uVar9 & 0xffffffffffff));
    }
    else {
      Disk::Bounds(&local_48,(Disk *)(uVar9 & 0xffffffffffff));
    }
  }
  else {
    uVar4 = uVar4 - 3;
    this_00 = (Curve *)(uVar9 & 0xffffffffffff);
    if (uVar4 < 2) {
      Triangle::Bounds(&local_48,(Triangle *)this_00);
    }
    else if (uVar4 == 2) {
      BilinearPatch::Bounds(&local_48,(BilinearPatch *)this_00);
    }
    else {
      Curve::Bounds(&local_48,this_00);
    }
  }
  auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)FStack_6c));
  fVar1 = (float)((uint)((byte)local_60 & 1) * 0x40000000 +
                 (uint)!(bool)((byte)local_60 & 1) * 0x3f800000) * (float)local_50 * (float)local_58
  ;
  uVar2 = vcmpss_avx512f(ZEXT416((uint)FStack_6c),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar3 = (bool)((byte)uVar2 & 1);
  __x = acosf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar15._0_4_));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_78._0_8_;
  bVar3 = this->twoSided;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       local_48.pMax.super_Tuple3<pbrt::Point3,_float>.y;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       local_48.pMax.super_Tuple3<pbrt::Point3,_float>.z;
  auVar15._0_4_ = local_78._0_4_ * local_78._0_4_;
  auVar15._4_4_ = local_78._4_4_ * local_78._4_4_;
  auVar15._8_8_ = 0;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       local_48.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       local_48.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  *(undefined8 *)&(__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z =
       local_48._8_8_;
  auVar15 = vmovshdup_avx(auVar15);
  auVar15 = vfmadd231ss_fma(auVar15,auVar13,auVar13);
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)local_78._8_4_),ZEXT416((uint)local_78._8_4_));
  auVar15 = vsqrtss_avx(auVar15,auVar15);
  fVar14 = auVar15._0_4_;
  auVar16._4_4_ = fVar14;
  auVar16._0_4_ = fVar14;
  auVar16._8_4_ = fVar14;
  auVar16._12_4_ = fVar14;
  auVar15 = vdivps_avx(auVar13,auVar16);
  uVar2 = vmovlps_avx(auVar15);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = (float)local_78._8_4_ / fVar14;
  __return_storage_ptr__->phi = fVar1 * 3.1415927 * fVar11;
  __return_storage_ptr__->theta_o = __x;
  __return_storage_ptr__->theta_e = 1.5707964;
  fVar11 = cosf(__x);
  __return_storage_ptr__->cosTheta_o = fVar11;
  __return_storage_ptr__->cosTheta_e = -4.371139e-08;
  __return_storage_ptr__->twoSided = bVar3;
  return __return_storage_ptr__;
}

Assistant:

LightBounds DiffuseAreaLight::Bounds() const {
    Float phi = 0;
    if (image) {
        // Assume no distortion in the mapping, FWIW...
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x)
                for (int c = 0; c < 3; ++c)
                    phi += image.GetChannel({x, y}, c);
        phi /= 3 * image.Resolution().x * image.Resolution().y;
    } else
        phi = Lemit.MaxValue();

    phi *= scale * (twoSided ? 2 : 1) * area * Pi;

    // TODO: for animated shapes, we probably need to worry about
    // renderFromLight as in SampleLi().
    DirectionCone nb = shape.NormalBounds();
    return LightBounds(shape.Bounds(), nb.w, phi, SafeACos(nb.cosTheta), Pi / 2,
                       twoSided);
}